

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day02b.cpp
# Opt level: O2

int day2b::get_bathroom_code(string *input)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  istream *piVar4;
  int iVar5;
  int value;
  int x;
  int iVar6;
  _Alloc_hider _Var7;
  string line;
  istringstream stream;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&stream,(string *)input,_S_in);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar3 = 2;
  iVar5 = 1;
  value = 0;
  x = 0;
  do {
    piVar4 = std::operator>>((istream *)&stream,(string *)&line);
    _Var7 = line._M_dataplus;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      iVar3 = reverse(value,0x10);
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::istringstream::~istringstream((istringstream *)&stream);
      return iVar3;
    }
    while (cVar1 = *_Var7._M_p, cVar1 != '\0') {
      _Var7._M_p = _Var7._M_p + 1;
      if (cVar1 == 'D') {
        iVar6 = iVar3 + 1;
        goto LAB_0010b00e;
      }
      if (cVar1 == 'L') {
        iVar6 = x + -1;
LAB_0010b02d:
        bVar2 = is_valid(iVar6,iVar3);
        if (bVar2) {
          x = iVar6;
        }
      }
      else {
        if (cVar1 == 'R') {
          iVar6 = x + 1;
          goto LAB_0010b02d;
        }
        if (cVar1 == 'U') {
          iVar6 = iVar3 + -1;
LAB_0010b00e:
          bVar2 = is_valid(x,iVar6);
          if (bVar2) {
            iVar3 = iVar6;
          }
        }
      }
    }
    value = value + (char)keypad[(long)x + (long)iVar3 * 5] * iVar5;
    iVar5 = iVar5 << 4;
  } while( true );
}

Assistant:

int get_bathroom_code(const std::string& input) {
		std::istringstream stream(input);
		std::string line;
		Position position{0,2};
		int code = 0;
		int i = 1;
		while(stream >> line) {
			const char* p = line.c_str();
			while(*p) {
				switch(*p++) {
				case 'U': if(is_valid(position.x, position.y - 1)) --position.y; break;
				case 'R': if(is_valid(position.x + 1, position.y)) ++position.x; break;
				case 'D': if(is_valid(position.x, position.y + 1)) ++position.y; break;
				case 'L': if(is_valid(position.x - 1, position.y)) --position.x; break;
				}
			}
			code += keypad[position.x + position.y * width] * i;
			i *= 16;
		}
		return reverse(code, 16);
	}